

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CoverageOptionSyntax::setChild
          (CoverageOptionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffa8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  undefined8 local_30;
  Info *local_28;
  ExpressionSyntax *local_20;
  not_null<slang::syntax::ExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7893ef);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x789417);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_20 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x789427);
      local_20 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (local_18,&local_20);
    *(ExpressionSyntax **)(in_RDI + 0x50) = local_18[0].ptr;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffa8);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x58) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x60) = local_28;
  }
  return;
}

Assistant:

void CoverageOptionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}